

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O3

void __thiscall helics::BrokerBase::~BrokerBase(BrokerBase *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pcVar2;
  BaseTimeCoordinator *pBVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  
  this->_vptr_BrokerBase = (_func_int **)&PTR__BrokerBase_004c9b88;
  if (this->queueDisabled == false) {
    joinAllThreads(this);
  }
  p_Var1 = (this->prBuff).super___shared_ptr<helics::ProfilerBuffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  pcVar2 = (this->configString)._M_dataplus._M_p;
  paVar4 = &(this->configString).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar4) {
    operator_delete(pcVar2,paVar4->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->lastErrorString)._M_dataplus._M_p;
  paVar4 = &(this->lastErrorString).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar4) {
    operator_delete(pcVar2,paVar4->_M_allocated_capacity + 1);
  }
  p_Var1 = (this->mLogManager).super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  gmlc::containers::
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
  ~BlockingPriorityQueue(&this->actionQueue);
  pBVar3 = (this->timeCoord)._M_t.
           super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
           .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
  if (pBVar3 != (BaseTimeCoordinator *)0x0) {
    (*pBVar3->_vptr_BaseTimeCoordinator[1])();
  }
  (this->timeCoord)._M_t.
  super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
  ._M_t.
  super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
  .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl =
       (BaseTimeCoordinator *)0x0;
  if ((this->queueProcessingThread)._M_id._M_thread != 0) {
    std::terminate();
  }
  pcVar2 = (this->address)._M_dataplus._M_p;
  paVar4 = &(this->address).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar4) {
    operator_delete(pcVar2,paVar4->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->brokerKey)._M_dataplus._M_p;
  paVar4 = &(this->brokerKey).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar4) {
    operator_delete(pcVar2,paVar4->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->identifier)._M_dataplus._M_p;
  paVar4 = &(this->identifier).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar4) {
    operator_delete(pcVar2,paVar4->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

BrokerBase::~BrokerBase()
{
    if (!queueDisabled) {
        try {
            joinAllThreads();
        }
        catch (...) {
            ;  // no exceptions in the destructor
        }
    }
}